

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::Resize
          (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this,
          hash_t nhsize)

{
  bool bVar1;
  Node *pNVar2;
  FString local_38;
  Node *local_30;
  Node *n;
  Node *nold;
  uint local_18;
  hash_t oldhsize;
  hash_t i;
  hash_t nhsize_local;
  TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this_local;
  
  nold._4_4_ = this->Size;
  n = this->Nodes;
  oldhsize = nhsize;
  _i = this;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  for (local_18 = 0; local_18 < nold._4_4_; local_18 = local_18 + 1) {
    bVar1 = Node::IsNil(n + local_18);
    if (!bVar1) {
      FString::FString(&local_38,&n[local_18].Pair.Key);
      pNVar2 = NewKey(this,&local_38);
      FString::~FString(&local_38);
      (pNVar2->Pair).Value.Count = n[local_18].Pair.Value.Count;
      local_30 = pNVar2;
      Node::~Node(n + local_18);
    }
  }
  M_Free(n);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}